

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinKrylovDemo_ls.c
# Opt level: O0

void WebRate(sunrealtype xx,sunrealtype yy,sunrealtype *cxy,sunrealtype *ratesxy,void *user_data)

{
  long in_RDX;
  long in_RSI;
  sunrealtype *in_RDI;
  double in_XMM0_Qa;
  sunrealtype sVar1;
  double in_XMM1_Qa;
  UserData data;
  sunrealtype fac;
  int i;
  int local_2c;
  
  for (local_2c = 0; local_2c < 6; local_2c = local_2c + 1) {
    sVar1 = DotProd(6,in_RDI,*(sunrealtype **)(*(long *)(in_RDX + 400) + (long)local_2c * 8));
    *(sunrealtype *)(in_RSI + (long)local_2c * 8) = sVar1;
  }
  for (local_2c = 0; local_2c < 6; local_2c = local_2c + 1) {
    *(double *)(in_RSI + (long)local_2c * 8) =
         in_RDI[local_2c] *
         (*(double *)(*(long *)(in_RDX + 0x198) + (long)local_2c * 8) *
          (in_XMM0_Qa * 1.0 * in_XMM1_Qa + 1.0) + *(double *)(in_RSI + (long)local_2c * 8));
  }
  return;
}

Assistant:

static void WebRate(sunrealtype xx, sunrealtype yy, sunrealtype* cxy,
                    sunrealtype* ratesxy, void* user_data)
{
  int i;
  sunrealtype fac;
  UserData data;

  data = (UserData)user_data;

  for (i = 0; i < NUM_SPECIES; i++)
  {
    ratesxy[i] = DotProd(NUM_SPECIES, cxy, acoef[i]);
  }

  fac = ONE + ALPHA * xx * yy;

  for (i = 0; i < NUM_SPECIES; i++)
  {
    ratesxy[i] = cxy[i] * (bcoef[i] * fac + ratesxy[i]);
  }
}